

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O2

TScreen * ImTui_ImplNcurses_Init(bool mouseSupport,float fps_active,float fps_idle)

{
  ImGuiIO *pIVar1;
  float fVar2;
  float fVar5;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  VSync local_38;
  
  if (g_screen == (TScreen *)0x0) {
    g_screen = (TScreen *)operator_new(0x18);
    g_screen->nx = 0;
    g_screen->ny = 0;
    *(undefined8 *)&g_screen->nmax = 0;
    g_screen->data = (TCell *)0x0;
  }
  fVar2 = (float)(~-(uint)(fps_idle < 0.0) & (uint)fps_idle |
                 -(uint)(fps_idle < 0.0) & (uint)fps_active);
  if (fps_active <= fVar2) {
    fVar2 = fps_active;
  }
  anon_unknown.dwarf_38c6c::VSync::VSync(&local_38,(double)fps_active,(double)fVar2);
  g_vsync.tLast_us = local_38.tLast_us;
  g_vsync.tNext_us = local_38.tNext_us;
  g_vsync.tStepActive_us = local_38.tStepActive_us;
  g_vsync.tStepIdle_us = local_38.tStepIdle_us;
  initscr();
  use_default_colors();
  start_color();
  cbreak();
  noecho();
  curs_set(0);
  nodelay(_stdscr,1);
  wtimeout(_stdscr,1);
  set_escdelay(0x19);
  keypad(_stdscr,1);
  if (mouseSupport) {
    mouseinterval(0);
    mousemask(0x1fffffff,0);
    puts("\x1b[?1003h");
  }
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0] = 9;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[1] = 0x104;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[2] = 0x105;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[3] = 0x103;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[4] = 0x102;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[5] = 0x153;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[6] = 0x152;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[7] = 0x106;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[8] = 0x168;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[9] = 0x14b;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[10] = 0x14a;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0xb] = 0x107;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0xc] = 0x20;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0xd] = 10;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0xe] = 0x1b;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0xf] = 0x157;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0x10] = 1;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0x11] = 3;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0x12] = 0x16;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0x13] = 0x18;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0x14] = 0x19;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyMap[0x15] = 0x1a;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyRepeatDelay = 0.05;
  pIVar1 = ImGui::GetIO();
  pIVar1->KeyRepeatRate = 0.05;
  if (_stdscr == 0) {
    fVar2 = -1.0;
    fVar5 = -1.0;
  }
  else {
    auVar4 = pshuflw(ZEXT416(*(uint *)(_stdscr + 4)),ZEXT416(*(uint *)(_stdscr + 4)),0x60);
    fVar2 = (float)((auVar4._0_4_ >> 0x10) + 1);
    fVar5 = (float)((auVar4._4_4_ >> 0x10) + 1);
  }
  pIVar1 = ImGui::GetIO();
  IVar3.y = fVar2;
  IVar3.x = fVar5;
  pIVar1->DisplaySize = IVar3;
  return g_screen;
}

Assistant:

ImTui::TScreen * ImTui_ImplNcurses_Init(bool mouseSupport, float fps_active, float fps_idle) {
    if (g_screen == nullptr) {
        g_screen = new ImTui::TScreen();
    }

    if (fps_idle < 0.0) {
        fps_idle = fps_active;
    }
    fps_idle = std::min(fps_active, fps_idle);
    g_vsync = VSync(fps_active, fps_idle);

    initscr();
    use_default_colors();
    start_color();
    cbreak();
    noecho();
    curs_set(0);
    nodelay(stdscr, TRUE);
    wtimeout(stdscr, 1);
    set_escdelay(25);
    keypad(stdscr, true);

    if (mouseSupport) {
        mouseinterval(0);
        mousemask(ALL_MOUSE_EVENTS | REPORT_MOUSE_POSITION, NULL);
        printf("\033[?1003h\n");
    }

    ImGui::GetIO().KeyMap[ImGuiKey_Tab]         = 9;
    ImGui::GetIO().KeyMap[ImGuiKey_LeftArrow]   = 260;
    ImGui::GetIO().KeyMap[ImGuiKey_RightArrow]  = 261;
    ImGui::GetIO().KeyMap[ImGuiKey_UpArrow]     = 259;
    ImGui::GetIO().KeyMap[ImGuiKey_DownArrow]   = 258;
    ImGui::GetIO().KeyMap[ImGuiKey_PageUp]      = 339;
    ImGui::GetIO().KeyMap[ImGuiKey_PageDown]    = 338;
    ImGui::GetIO().KeyMap[ImGuiKey_Home]        = 262;
    ImGui::GetIO().KeyMap[ImGuiKey_End]         = 360;
    ImGui::GetIO().KeyMap[ImGuiKey_Insert]      = 331;
    ImGui::GetIO().KeyMap[ImGuiKey_Delete]      = 330;
    ImGui::GetIO().KeyMap[ImGuiKey_Backspace]   = 263;
    ImGui::GetIO().KeyMap[ImGuiKey_Space]       = 32;
    ImGui::GetIO().KeyMap[ImGuiKey_Enter]       = 10;
    ImGui::GetIO().KeyMap[ImGuiKey_Escape]      = 27;
    ImGui::GetIO().KeyMap[ImGuiKey_KeyPadEnter] = 343;
    ImGui::GetIO().KeyMap[ImGuiKey_A]           = 1;
    ImGui::GetIO().KeyMap[ImGuiKey_C]           = 3;
    ImGui::GetIO().KeyMap[ImGuiKey_V]           = 22;
    ImGui::GetIO().KeyMap[ImGuiKey_X]           = 24;
    ImGui::GetIO().KeyMap[ImGuiKey_Y]           = 25;
    ImGui::GetIO().KeyMap[ImGuiKey_Z]           = 26;

    ImGui::GetIO().KeyRepeatDelay = 0.050;
    ImGui::GetIO().KeyRepeatRate = 0.050;

	int screenSizeX = 0;
	int screenSizeY = 0;

	getmaxyx(stdscr, screenSizeY, screenSizeX);
	ImGui::GetIO().DisplaySize = ImVec2(screenSizeX, screenSizeY);

    return g_screen;
}